

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_dds.cxx
# Opt level: O1

bool __thiscall xray_re::xr_image::save_dds(xr_image *this,xr_writer *w,irect *rect)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  rgba32 *__dest;
  uint uVar5;
  uint width;
  ulong uVar6;
  rgba32 *__src;
  rgba32 *data;
  uint height;
  InputOptions in_opts;
  OutputOptions out_opts;
  CompressionOptions comp_opts;
  dds_writer dds;
  InputOptions local_80;
  OutputOptions local_78;
  CompressionOptions local_70;
  Compressor local_68;
  uint local_5c;
  rgba32 *local_58;
  xr_image *local_50;
  xr_writer *local_48;
  OutputHandler local_40;
  xr_writer *local_38;
  
  if (rect == (irect *)0x0) {
    height = this->m_height;
    data = this->m_data;
    width = this->m_width;
  }
  else {
    iVar1 = (rect->field_0).field_1.x1;
    iVar2 = (rect->field_0).field_1.y1;
    uVar5 = ((rect->field_0).field_1.x2 - iVar1) + 1U & 0x7fffffff;
    height = ((rect->field_0).field_1.y2 - iVar2) + 1U & 0x7fffffff;
    __dest = (rgba32 *)operator_new__((ulong)(height * uVar5) << 2);
    data = __dest;
    width = uVar5;
    if (height != 0) {
      uVar3 = this->m_width;
      __src = this->m_data + (iVar2 * uVar3 + iVar1);
      uVar6 = (ulong)height;
      local_5c = uVar5;
      local_58 = __dest;
      local_50 = this;
      local_48 = w;
      do {
        memcpy(__dest,__src,(ulong)uVar5 * 4);
        __dest = __dest + uVar5;
        __src = __src + uVar3;
        uVar6 = uVar6 - 1;
        this = local_50;
        data = local_58;
        w = local_48;
        width = local_5c;
      } while (uVar6 != 0);
    }
  }
  nvtt::InputOptions::InputOptions(&local_80);
  nvtt::InputOptions::setTextureLayout(&local_80,TextureType_2D,width,height,1);
  nvtt::InputOptions::setWrapMode(&local_80,WrapMode_Clamp);
  nvtt::InputOptions::setMipmapData(&local_80,data,width,height,1,0,0);
  if ((data != (rgba32 *)0x0) && (data != this->m_data)) {
    operator_delete__(data);
  }
  nvtt::InputOptions::setNormalMap(&local_80,false);
  nvtt::InputOptions::setConvertToNormalMap(&local_80,false);
  nvtt::InputOptions::setGamma(&local_80,2.2,2.2);
  nvtt::InputOptions::setNormalizeMipmaps(&local_80,false);
  nvtt::CompressionOptions::CompressionOptions(&local_70);
  nvtt::CompressionOptions::setFormat(&local_70,Format_BC3);
  nvtt::CompressionOptions::setQuality(&local_70,Quality_Highest);
  nvtt::OutputOptions::OutputOptions(&local_78);
  local_40._vptr_OutputHandler = (_func_int **)&PTR__OutputHandler_00248890;
  local_38 = w;
  nvtt::OutputOptions::setOutputHandler(&local_78,&local_40);
  nvtt::OutputOptions::setErrorHandler(&local_78,(ErrorHandler *)0x0);
  nvtt::Compressor::Compressor(&local_68);
  bVar4 = nvtt::Compressor::process(&local_68,&local_80,&local_70,&local_78);
  nvtt::Compressor::~Compressor(&local_68);
  nvtt::OutputOptions::~OutputOptions(&local_78);
  nvtt::CompressionOptions::~CompressionOptions(&local_70);
  nvtt::InputOptions::~InputOptions(&local_80);
  return bVar4;
}

Assistant:

bool xr_image::save_dds(xr_writer& w, const irect* rect) const
{
#if 1
	int width, height;
	rgba32* data;
	if (rect) {
		width = int((rect->x2 - rect->x1 + 1) & INT_MAX);
		height = int((rect->y2 - rect->y1 + 1) & INT_MAX);
		data = new rgba32[width * height];
		const rgba32* src_data = &m_data[rect->y1*m_width + rect->x1];
		for (int i = 0; i != height; ++i) {
			memcpy(&data[i*width], src_data, width*sizeof(rgba32));
			src_data += m_width;
		}
	} else {
		width = m_width;
		height = m_height;
		data = m_data;
	}
#else
	int width = int(m_width & INT_MAX);
	int height = int(m_height & INT_MAX);
	const rgba32* data = m_data;
#endif

	nvtt::InputOptions in_opts;
	in_opts.setTextureLayout(nvtt::TextureType_2D, width, height);
	in_opts.setWrapMode(nvtt::WrapMode_Clamp);
	in_opts.setMipmapData(data, width, height);
	if (data != m_data)
		delete[] data;
	in_opts.setNormalMap(false);
	in_opts.setConvertToNormalMap(false);
	in_opts.setGamma(2.2f, 2.2f);
	in_opts.setNormalizeMipmaps(false);

	nvtt::CompressionOptions comp_opts;
	comp_opts.setFormat(nvtt::Format_BC3);
	comp_opts.setQuality(nvtt::Quality_Highest);

	nvtt::OutputOptions out_opts;
	dds_writer dds(w);
	out_opts.setOutputHandler(&dds);
	out_opts.setErrorHandler(0);

	return nvtt::Compressor().process(in_opts, comp_opts, out_opts);
}